

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t x_data,double y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  undefined8 uVar2;
  string_t new_value;
  double local_20;
  
  uVar2 = x_data.value._8_8_;
  new_value.value._0_8_ = x_data.value._0_8_;
  local_20 = y_data;
  bVar1 = GreaterThan::Operation<double>((double *)(this + 0x18),&local_20);
  if (bVar1) {
    new_value.value.pointer.ptr = (char *)uVar2;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)(this + 8),(string_t *)state,new_value);
    *(double *)(this + 0x18) = local_20;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}